

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_other_variables(Impl *this)

{
  uint cols;
  Id IVar1;
  Id sizeId;
  Builder *this_00;
  BuiltIn builtin;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  if (((this->execution_model == ExecutionModelMeshEXT) &&
      ((this->execution_mode_meta).stage_output_num_primitive != 0)) &&
     (cols = (this->execution_mode_meta).primitive_index_dimension, cols != 0)) {
    IVar1 = get_type_id(this,U32,1,cols,false);
    sizeId = spv::Builder::makeUintConstant
                       (this_00,(this->execution_mode_meta).stage_output_num_primitive,false);
    IVar1 = spv::Builder::makeArrayType(this_00,IVar1,sizeId,0);
    IVar1 = create_variable(this,StorageClassOutput,IVar1,"indices");
    this->primitive_index_array_id = IVar1;
    builtin = (cols == 3) + BuiltInPrimitiveLineIndicesEXT;
    spv::Builder::addDecoration(this_00,IVar1,DecorationBuiltIn,builtin);
    SPIRVModule::register_builtin_shader_output
              (this->spirv_module,this->primitive_index_array_id,builtin);
  }
  return true;
}

Assistant:

bool Converter::Impl::emit_other_variables()
{
	auto &builder = spirv_module.get_builder();

	if (execution_model == spv::ExecutionModelMeshEXT && execution_mode_meta.stage_output_num_primitive)
	{
		unsigned index_dim = execution_mode_meta.primitive_index_dimension;

		if (index_dim)
		{
			spv::Id type_id = builder.makeArrayType(
				get_type_id(DXIL::ComponentType::U32, 1, index_dim),
				builder.makeUintConstant(execution_mode_meta.stage_output_num_primitive, false), 0);
			primitive_index_array_id = create_variable(spv::StorageClassOutput, type_id, "indices");

			spv::BuiltIn builtin_id =
			    index_dim == 3 ? spv::BuiltInPrimitiveTriangleIndicesEXT : spv::BuiltInPrimitiveLineIndicesEXT;
			builder.addDecoration(primitive_index_array_id, spv::DecorationBuiltIn, builtin_id);
			spirv_module.register_builtin_shader_output(primitive_index_array_id, builtin_id);
		}
	}

	return true;
}